

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getTypeInfoFromNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *localPart)

{
  XMLBuffer *this_00;
  _func_int **pp_Var1;
  XMLCh *key1;
  bool bVar2;
  int iVar3;
  Grammar *pGVar4;
  XMLSize_t XVar5;
  ulong uVar6;
  XMLCh *pXVar7;
  XMLCh XVar8;
  undefined8 *puVar9;
  
  pGVar4 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if ((pGVar4 == (Grammar *)0x0) ||
     (iVar3 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])(pGVar4), iVar3 != 1)) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,uriStr,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    this_00 = &this->fBuffer;
    (this->fBuffer).fIndex = 0;
    if ((uriStr == (XMLCh *)0x0) || (*uriStr == L'\0')) {
      XVar5 = 0;
    }
    else {
      XMLBuffer::append(this_00,uriStr);
      XVar5 = this_00->fIndex;
    }
    if (XVar5 == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar5 = this_00->fIndex;
    }
    (this->fBuffer).fIndex = XVar5 + 1;
    (this->fBuffer).fBuffer[XVar5] = L',';
    XMLBuffer::append(this_00,localPart);
    pp_Var1 = pGVar4[7].super_XSerializable._vptr_XSerializable;
    key1 = (this->fBuffer).fBuffer;
    key1[(this->fBuffer).fIndex] = L'\0';
    uVar6 = (ulong)(ushort)*key1;
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      XVar8 = key1[1];
      if (XVar8 != L'\0') {
        pXVar7 = key1 + 2;
        do {
          uVar6 = (ulong)(ushort)XVar8 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar8 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar8 != L'\0');
      }
      uVar6 = uVar6 % (ulong)pp_Var1[3];
    }
    puVar9 = *(undefined8 **)(pp_Var1[2] + uVar6 * 8);
    if (puVar9 != (undefined8 *)0x0) {
      do {
        bVar2 = StringHasher::equals((StringHasher *)(pp_Var1 + 6),key1,(void *)puVar9[2]);
        if (bVar2) {
          return (ComplexTypeInfo *)*puVar9;
        }
        puVar9 = (undefined8 *)puVar9[1];
      } while (puVar9 != (undefined8 *)0x0);
    }
  }
  return (ComplexTypeInfo *)0x0;
}

Assistant:

ComplexTypeInfo* TraverseSchema::getTypeInfoFromNS(const DOMElement* const elem,
                                                   const XMLCh* const uriStr,
                                                   const XMLCh* const localPart)
{

    Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

    if (grammar != 0 && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        ComplexTypeInfo* typeInfo =
            ((SchemaGrammar*)grammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        return typeInfo;
    }
    else {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
    }

    return 0;
}